

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseOperatorName(State *state,int *arity)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  State *pSVar6;
  char *pcVar7;
  undefined4 *in_RSI;
  State *in_RDI;
  AbbrevPair *p;
  ParseState copy;
  ComplexityGuard guard;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  State *in_stack_ffffffffffffff70;
  State *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff90;
  char one_char_token;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  long *local_50;
  int iStack_3c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ComplexityGuard local_20;
  undefined4 *local_18;
  State *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    local_1 = 0;
  }
  else {
    pSVar6 = (State *)RemainingInput(local_10);
    bVar4 = AtLeastNumCharsRemaining((char *)pSVar6,2);
    if (bVar4) {
      uVar1 = (local_10->parse_state).mangled_idx;
      uVar2 = (local_10->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
      bVar4 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           in_stack_ffffffffffffff98)),
                                in_stack_ffffffffffffff90);
      if ((((bVar4) &&
           (bVar4 = MaybeAppend(in_stack_ffffffffffffff70,
                                (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68
                                                )), bVar4)) &&
          (bVar4 = EnterNestedName(local_10), bVar4)) &&
         (bVar4 = ParseConversionOperatorType
                            ((State *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
         , bVar4)) {
        iStack_3c = (int)((ulong)uVar3 >> 0x20);
        bVar4 = LeaveNestedName(local_10,(short)(iStack_3c * 2 >> 0x11));
        if (bVar4) {
          if (local_18 != (undefined4 *)0x0) {
            *local_18 = 1;
          }
          local_1 = 1;
          goto LAB_003d85c0;
        }
      }
      (local_10->parse_state).mangled_idx = uVar1;
      (local_10->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           in_stack_ffffffffffffff98)),
                                in_stack_ffffffffffffff90);
      one_char_token = (char)((ulong)in_stack_ffffffffffffff90 >> 0x38);
      if (((bVar4) &&
          (bVar4 = MaybeAppend(in_stack_ffffffffffffff70,
                               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                              ), bVar4)) && (bVar4 = ParseSourceName(pSVar6), bVar4)) {
        local_1 = 1;
      }
      else {
        (local_10->parse_state).mangled_idx = uVar1;
        (local_10->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff9f,
                                                    CONCAT16(in_stack_ffffffffffffff9e,
                                                             in_stack_ffffffffffffff98)),
                                  one_char_token);
        if (((bVar4) &&
            (bVar4 = ParseDigit(in_stack_ffffffffffffff78,(int *)in_stack_ffffffffffffff70), bVar4))
           && (bVar4 = ParseSourceName(pSVar6), bVar4)) {
          local_1 = 1;
        }
        else {
          (local_10->parse_state).mangled_idx = uVar1;
          (local_10->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar3;
          pcVar7 = RemainingInput(local_10);
          bVar4 = IsLower(*pcVar7);
          if (bVar4) {
            pcVar7 = RemainingInput(local_10);
            bVar4 = IsAlpha(pcVar7[1]);
            if (bVar4) {
              for (local_50 = &kOperatorList; *local_50 != 0; local_50 = local_50 + 3) {
                pcVar7 = RemainingInput(local_10);
                if ((*pcVar7 == *(char *)*local_50) &&
                   (pSVar6 = (State *)RemainingInput(local_10),
                   *(char *)((long)&pSVar6->mangled_begin + 1) == *(char *)(*local_50 + 1))) {
                  if (local_18 != (undefined4 *)0x0) {
                    *local_18 = (int)local_50[2];
                  }
                  MaybeAppend(pSVar6,(char *)CONCAT17(in_stack_ffffffffffffff6f,
                                                      in_stack_ffffffffffffff68));
                  uVar5 = IsLower(*(char *)local_50[1]);
                  if ((bool)uVar5) {
                    MaybeAppend(pSVar6,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
                  }
                  MaybeAppend(pSVar6,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
                  (local_10->parse_state).mangled_idx = (local_10->parse_state).mangled_idx + 2;
                  anon_unknown_3::UpdateHighWaterMark(local_10);
                  local_1 = 1;
                  goto LAB_003d85c0;
                }
              }
              local_1 = 0;
              goto LAB_003d85c0;
            }
          }
          local_1 = 0;
        }
      }
    }
    else {
      local_1 = 0;
    }
  }
LAB_003d85c0:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseOperatorName(State *state, int *arity) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "cv") && MaybeAppend(state, "operator ") &&
      EnterNestedName(state) && ParseConversionOperatorType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    if (arity != nullptr) {
      *arity = 1;
    }
    return true;
  }
  state->parse_state = copy;

  // Then user-defined literals.
  if (ParseTwoCharToken(state, "li") && MaybeAppend(state, "operator\"\" ") &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseDigit(state, arity) &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(RemainingInput(state)[0]) &&
        IsAlpha(RemainingInput(state)[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != nullptr; ++p) {
    if (RemainingInput(state)[0] == p->abbrev[0] &&
        RemainingInput(state)[1] == p->abbrev[1]) {
      if (arity != nullptr) {
        *arity = p->arity;
      }
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->parse_state.mangled_idx += 2;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}